

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  NameContext *pNVar6;
  Parse *pPVar7;
  SrcList *pSVar8;
  AggInfo *pAVar9;
  ExprList *pEVar10;
  Expr *pEVar11;
  bool bVar12;
  AggInfo_col *pAVar13;
  AggInfo_func *pAVar14;
  FuncDef *pFVar15;
  uint uVar16;
  ulong uVar17;
  SrcList_item *pSVar18;
  int *piVar19;
  ExprList_item *pEVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int i;
  int i_1;
  int local_44;
  int *local_40;
  int local_34;
  
  pNVar6 = (pWalker->u).pNC;
  pPVar7 = pNVar6->pParse;
  pSVar8 = pNVar6->pSrcList;
  pAVar9 = pNVar6->pAggInfo;
  uVar1 = pExpr->op;
  if (uVar1 != 0x9a) {
    if (uVar1 == 0x99) {
      if ((pNVar6->ncFlags & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      if (pAVar9->nFunc < 1) {
        uVar17 = 0;
      }
      else {
        pAVar14 = pAVar9->aFunc;
        uVar17 = 0;
        do {
          iVar22 = sqlite3ExprCompare((Parse *)0x0,pAVar14->pExpr,pExpr,-1);
          if (iVar22 == 0) break;
          uVar23 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar23;
          pAVar14 = pAVar14 + 1;
        } while ((int)uVar23 < pAVar9->nFunc);
      }
      if (pAVar9->nFunc <= (int)uVar17) {
        uVar1 = pPVar7->db->enc;
        pAVar14 = (AggInfo_func *)
                  sqlite3ArrayAllocate(pPVar7->db,pAVar9->aFunc,0x18,&pAVar9->nFunc,&local_34);
        pAVar9->aFunc = pAVar14;
        uVar17 = (ulong)local_34;
        if (-1 < (long)uVar17) {
          pAVar14[uVar17].pExpr = pExpr;
          iVar22 = pPVar7->nMem + 1;
          pPVar7->nMem = iVar22;
          pAVar14[uVar17].iMem = iVar22;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar22 = 0;
          }
          else {
            iVar22 = ((pExpr->x).pList)->nExpr;
          }
          pFVar15 = sqlite3FindFunction(pPVar7->db,(pExpr->u).zToken,iVar22,uVar1,'\0');
          pAVar14[uVar17].pFunc = pFVar15;
          iVar22 = -1;
          if ((pExpr->flags & 0x10) != 0) {
            iVar22 = pPVar7->nTab;
            pPVar7->nTab = iVar22 + 1;
          }
          pAVar14[uVar17].iDistinct = iVar22;
        }
      }
      pExpr->iAgg = (i16)uVar17;
      pExpr->pAggInfo = pAVar9;
      return 1;
    }
    if (uVar1 != 0x98) {
      return 0;
    }
  }
  if (pSVar8 == (SrcList *)0x0) {
    return 1;
  }
  if (pSVar8->nSrc < 1) {
    return 1;
  }
  pSVar18 = pSVar8->a;
  local_40 = &pAVar9->nColumn;
  iVar22 = 0;
  do {
    iVar3 = pExpr->iTable;
    iVar4 = pSVar18->iCursor;
    if (iVar3 == iVar4) {
      uVar23 = pAVar9->nColumn;
      bVar12 = 0 < (int)uVar23;
      if (0 < (int)uVar23) {
        piVar19 = &pAVar9->aCol->iColumn;
        uVar17 = 0;
        do {
          if ((piVar19[-1] == iVar3) && (*piVar19 == (int)pExpr->iColumn)) {
            if (bVar12) goto LAB_001768a8;
            break;
          }
          uVar16 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar16;
          bVar12 = (int)uVar16 < (int)uVar23;
          piVar19 = piVar19 + 8;
        } while (uVar23 != uVar16);
      }
      pAVar13 = (AggInfo_col *)sqlite3ArrayAllocate(pPVar7->db,pAVar9->aCol,0x20,local_40,&local_44)
      ;
      pAVar9->aCol = pAVar13;
      uVar17 = (ulong)local_44;
      if (-1 < (long)uVar17) {
        pAVar13[uVar17].pTab = pExpr->pTab;
        iVar5 = pExpr->iTable;
        pAVar13[uVar17].iTable = iVar5;
        sVar2 = pExpr->iColumn;
        pAVar13[uVar17].iColumn = (int)sVar2;
        iVar21 = pPVar7->nMem + 1;
        pPVar7->nMem = iVar21;
        pAVar13[uVar17].iMem = iVar21;
        pAVar13[uVar17].iSorterColumn = -1;
        pAVar13[uVar17].pExpr = pExpr;
        pEVar10 = pAVar9->pGroupBy;
        if ((pEVar10 != (ExprList *)0x0) && (0 < pEVar10->nExpr)) {
          pEVar20 = pEVar10->a;
          iVar21 = 0;
          do {
            pEVar11 = pEVar20->pExpr;
            if (((pEVar11->op == 0x98) && (pEVar11->iTable == iVar5)) && (pEVar11->iColumn == sVar2)
               ) {
              pAVar13[uVar17].iSorterColumn = iVar21;
              break;
            }
            iVar21 = iVar21 + 1;
            pEVar20 = pEVar20 + 1;
          } while (pEVar10->nExpr != iVar21);
        }
        if (pAVar13[uVar17].iSorterColumn < 0) {
          iVar5 = pAVar9->nSortingColumn;
          pAVar9->nSortingColumn = iVar5 + 1;
          pAVar13[uVar17].iSorterColumn = iVar5;
        }
      }
LAB_001768a8:
      pExpr->pAggInfo = pAVar9;
      pExpr->op = 0x9a;
      pExpr->iAgg = (i16)uVar17;
      if (iVar3 == iVar4) {
        return 1;
      }
    }
    iVar22 = iVar22 + 1;
    pSVar18 = pSVar18 + 1;
    if (pSVar8->nSrc <= iVar22) {
      return 1;
    }
  } while( true );
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}